

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::phase1UpdatePrimal(HEkkPrimal *this)

{
  HighsInt *pHVar1;
  int iVar2;
  int iVar3;
  HEkk *pHVar4;
  pointer piVar5;
  pointer pdVar6;
  HEkk *this_00;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  int iVar10;
  HighsInt iEl;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  lVar11 = 0;
  HighsSimplexAnalysis::simplexTimerStart(this->analysis,0x4b,0);
  pHVar4 = this->ekk_instance_;
  HVectorBase<double>::clear(&this->col_basic_feasibility_change);
  dVar12 = (pHVar4->info_).primal_simplex_phase1_cost_perturbation_multiplier * 5e-07;
  piVar5 = (this->col_aq).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (this->col_aq).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = this->ekk_instance_;
  pdVar7 = (this->col_basic_feasibility_change).array.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar8 = (this->col_basic_feasibility_change).index.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  do {
    if ((this->col_aq).count <= lVar11) {
      HEkk::invalidatePrimalMaxSumInfeasibilityRecord(this_00);
      HighsSimplexAnalysis::simplexTimerStop(this->analysis,0x4b,0);
      return;
    }
    iVar2 = piVar5[lVar11];
    pdVar9 = (pHVar4->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar14 = pdVar9[iVar2] - this->theta_primal * pdVar6[iVar2];
    pdVar9[iVar2] = dVar14;
    dVar13 = -1.0;
    if (((pHVar4->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[iVar2] - this->primal_feasibility_tolerance <= dVar14) &&
       (dVar13 = 0.0,
       this->primal_feasibility_tolerance +
       (pHVar4->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[iVar2] < dVar14)) {
      dVar13 = 1.0;
    }
    iVar3 = (this_00->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[iVar2];
    pdVar9 = (pHVar4->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar14 = pdVar9[iVar3];
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      dVar13 = dVar13 * ((pHVar4->info_).numTotRandomValue_.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar2] * dVar12 + 1.0);
    }
    pdVar9[iVar3] = dVar13;
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      iVar10 = -1;
      if ((dVar13 == 0.0) && (!NAN(dVar13))) goto LAB_00346f68;
    }
    else {
      iVar10 = 1;
      if ((dVar13 != 0.0) || (NAN(dVar13))) {
LAB_00346f68:
        pHVar1 = &(pHVar4->info_).num_primal_infeasibilities;
        *pHVar1 = *pHVar1 + iVar10;
      }
    }
    dVar13 = dVar13 - dVar14;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      pdVar7[iVar2] = dVar13;
      iVar10 = (this->col_basic_feasibility_change).count;
      (this->col_basic_feasibility_change).count = iVar10 + 1;
      piVar8[iVar10] = iVar2;
      if (this->num_col <= iVar3) {
        pdVar9 = (pHVar4->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar9[iVar3] = dVar13 + pdVar9[iVar3];
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

void HEkkPrimal::phase1UpdatePrimal() {
  analysis->simplexTimerStart(UpdatePrimalClock);
  HighsSimplexInfo& info = ekk_instance_.info_;
  col_basic_feasibility_change.clear();
  //
  // Update basic primal values, identifying all the feasibility
  // changes giving a value to col_basic_feasibility_change so that the duals
  // can be updated.
  //
  // Determine the base value for cost perturbation
  const double base =
      info.primal_simplex_phase1_cost_perturbation_multiplier * 5e-7;
  //  if (ekk_instance_.sparseLoopStyle(col_aq.count, num_row, to_entry)) {
  for (HighsInt iEl = 0; iEl < col_aq.count; iEl++) {
    HighsInt iRow = col_aq.index[iEl];
    info.baseValue_[iRow] -= theta_primal * col_aq.array[iRow];
    HighsInt iCol = ekk_instance_.basis_.basicIndex_[iRow];
    double was_cost = info.workCost_[iCol];
    const double value = info.baseValue_[iRow];
    const double lower = info.baseLower_[iRow];
    const double upper = info.baseUpper_[iRow];
    HighsInt bound_violated = 0;
    if (value < lower - primal_feasibility_tolerance) {
      bound_violated = -1.0;
    } else if (value > upper + primal_feasibility_tolerance) {
      bound_violated = 1.0;
    }
    double cost = bound_violated;
    if (base) cost *= 1 + base * info.numTotRandomValue_[iRow];
    info.workCost_[iCol] = cost;
    if (was_cost) {
      if (!cost) info.num_primal_infeasibilities--;
    } else {
      if (cost) info.num_primal_infeasibilities++;
    }
    double delta_cost = cost - was_cost;
    if (delta_cost) {
      col_basic_feasibility_change.array[iRow] = delta_cost;
      col_basic_feasibility_change.index[col_basic_feasibility_change.count++] =
          iRow;
      if (iCol >= num_col) info.workDual_[iCol] += delta_cost;
    }
  }
  // Don't set baseValue[row_out] yet so that dual update due to
  // feasibility changes is done correctly
  ekk_instance_.invalidatePrimalMaxSumInfeasibilityRecord();
  analysis->simplexTimerStop(UpdatePrimalClock);
}